

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void test_max_min(void)

{
  uint64_t *puVar1;
  bool bVar2;
  _Bool _Var3;
  bitset_t *pbVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  bitset_t *pbVar8;
  long lVar9;
  long lVar10;
  bitset_t *pbVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong auStack_1a8 [4];
  bitset_t *pbStack_188;
  bitset_t *pbStack_180;
  code *pcStack_178;
  bitset_t *pbStack_168;
  undefined8 uStack_160;
  bitset_t *pbStack_158;
  code *pcStack_150;
  bitset_t *pbStack_140;
  bitset_t *pbStack_138;
  bitset_t *pbStack_130;
  ulong uStack_128;
  ulong uStack_120;
  bitset_t *pbStack_118;
  code *pcStack_110;
  bitset_t *pbStack_108;
  long lStack_100;
  ulong uStack_f8;
  bitset_t *pbStack_f0;
  code *pcStack_e8;
  bitset_t *pbStack_d8;
  ulong uStack_d0;
  ulong uStack_c8;
  bitset_t *pbStack_c0;
  long lStack_b8;
  code *pcStack_b0;
  size_t sStack_a8;
  long lStack_a0;
  long lStack_98;
  bitset_t *pbStack_90;
  code *pcStack_88;
  size_t sStack_80;
  bitset_t *pbStack_78;
  ulong uStack_70;
  
  uVar12 = 300;
  pbVar4 = bitset_create();
  while( true ) {
    uVar21 = uVar12 >> 6;
    if ((uVar21 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar21 + 1), _Var3)) {
      pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)uVar12 & 0x3f);
    }
    sVar5 = bitset_minimum(pbVar4);
    if (sVar5 != 300) break;
    sVar5 = bitset_maximum(pbVar4);
    if (uVar12 != sVar5) {
      test_max_min_cold_2();
      break;
    }
    uVar12 = uVar12 + 3;
    if (uVar12 == 3000) {
      bitset_free(pbVar4);
      return;
    }
  }
  test_max_min_cold_1();
  sVar5 = 0;
  while( true ) {
    uVar12 = 300;
    pbVar4 = bitset_create();
    do {
      uVar21 = uVar12 >> 6;
      if ((uVar21 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar21 + 1), _Var3)) {
        pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)uVar12 & 0x3f);
      }
      uVar12 = uVar12 + 3;
    } while (uVar12 != 15000);
    sVar6 = bitset_count(pbVar4);
    bitset_shift_left(pbVar4,sVar5);
    sVar7 = bitset_count(pbVar4);
    if (sVar7 != sVar6) break;
    lVar9 = 300;
    do {
      uVar12 = sVar5 + lVar9 >> 6;
      if ((pbVar4->arraysize <= uVar12) ||
         ((pbVar4->array[uVar12] >> (sVar5 + lVar9 & 0x3f) & 1) == 0)) {
        test_shift_left_cold_2();
        goto LAB_00101ce7;
      }
      lVar9 = lVar9 + 3;
    } while (lVar9 != 15000);
    bitset_free(pbVar4);
    sVar5 = sVar5 + 1;
    if (sVar5 == 0x100) {
      return;
    }
  }
LAB_00101ce7:
  test_shift_left_cold_1();
  pbVar4 = bitset_create();
  if ((pbVar4->arraysize != 0) || (_Var3 = bitset_grow(pbVar4,1), _Var3)) {
    *pbVar4->array = *pbVar4->array | 2;
  }
  if ((pbVar4->arraysize != 0) || (_Var3 = bitset_grow(pbVar4,1), _Var3)) {
    *pbVar4->array = *pbVar4->array & 0xfffffffffffffffd;
  }
  if ((pbVar4->arraysize != 0) || (_Var3 = bitset_grow(pbVar4,1), _Var3)) {
    *pbVar4->array = *pbVar4->array & 0xfffffffffffffbff;
  }
  if ((pbVar4->arraysize != 0) || (_Var3 = bitset_grow(pbVar4,1), _Var3)) {
    *pbVar4->array = *pbVar4->array | 0x400;
  }
  if ((pbVar4->arraysize == 0) || ((*pbVar4->array & 0x400) == 0)) {
    test_set_to_val_cold_2();
  }
  else if ((pbVar4->arraysize == 0) || ((*pbVar4->array & 2) == 0)) {
    bitset_free(pbVar4);
    return;
  }
  test_set_to_val_cold_1();
  lVar9 = 0;
  lVar18 = 0;
  sStack_80 = 0;
  pbStack_78 = pbVar4;
  uStack_70 = uVar21;
  do {
    lVar13 = 300;
    pcStack_88 = (code *)0x101dca;
    pbVar4 = bitset_create();
    do {
      uVar12 = (ulong)(lVar18 + lVar13) >> 6;
      if (uVar12 < pbVar4->arraysize) {
LAB_00101df0:
        pbVar4->array[uVar12] = pbVar4->array[uVar12] | 1L << ((byte)(lVar18 + lVar13) & 0x3f);
      }
      else {
        pcStack_88 = (code *)0x101dec;
        _Var3 = bitset_grow(pbVar4,uVar12 + 1);
        if (_Var3) goto LAB_00101df0;
      }
      lVar13 = lVar13 + 3;
    } while (lVar13 != 0x3bc4);
    pcStack_88 = (code *)0x101e16;
    sVar6 = bitset_count(pbVar4);
    sVar5 = sStack_80;
    pcStack_88 = (code *)0x101e28;
    bitset_shift_right(pbVar4,sStack_80);
    pcStack_88 = (code *)0x101e30;
    sVar7 = bitset_count(pbVar4);
    if (sVar7 != sVar6) {
LAB_00101e9c:
      pcStack_88 = test_union_intersection;
      test_shift_right_cold_1();
      sStack_a8 = sVar5;
      pcStack_b0 = (code *)0x101eaf;
      lStack_a0 = lVar9;
      lStack_98 = lVar18;
      pbStack_90 = pbVar4;
      pcStack_88 = (code *)sVar6;
      pbVar4 = bitset_create();
      lVar9 = 0;
      pcStack_b0 = (code *)0x101eba;
      pbVar8 = bitset_create();
      uVar12 = 0;
      break;
    }
    lVar10 = 300;
    do {
      uVar12 = (ulong)(lVar9 + lVar10) >> 6;
      if ((pbVar4->arraysize <= uVar12) ||
         ((pbVar4->array[uVar12] >> (lVar9 + lVar10 & 0x3fU) & 1) == 0)) {
        pcStack_88 = (code *)0x101e9c;
        test_shift_right_cold_2();
        goto LAB_00101e9c;
      }
      lVar10 = lVar10 + 3;
    } while (lVar10 != 0x3bc4);
    pcStack_88 = (code *)0x101e70;
    bitset_free(pbVar4);
    sStack_80 = sVar5 + 1;
    lVar18 = lVar18 + 3;
    lVar9 = lVar9 + 2;
    if (sStack_80 == 0x100) {
      return;
    }
  } while( true );
  while( true ) {
    uVar12 = uVar12 + 1;
    lVar9 = lVar9 + 2;
    if (uVar12 == 1000) break;
    uVar21 = uVar12 >> 5;
    if (uVar21 < pbVar4->arraysize) {
LAB_00101edd:
      pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)lVar9 & 0x3e);
    }
    else {
      pcStack_b0 = (code *)0x101ed9;
      _Var3 = bitset_grow(pbVar4,uVar21 + 1);
      if (_Var3) goto LAB_00101edd;
    }
    if (uVar21 < pbVar8->arraysize) {
LAB_00101f08:
      pbVar8->array[uVar21] = pbVar8->array[uVar21] | 2L << ((byte)lVar9 & 0x3e);
    }
    else {
      pcStack_b0 = (code *)0x101f04;
      _Var3 = bitset_grow(pbVar8,uVar21 + 1);
      if (_Var3) goto LAB_00101f08;
    }
  }
  pcStack_b0 = (code *)0x101f38;
  bitset_inplace_symmetric_difference(pbVar4,pbVar8);
  pcStack_b0 = (code *)0x101f40;
  sVar5 = bitset_count(pbVar4);
  if (sVar5 == 2000) {
    pcStack_b0 = (code *)0x101f57;
    bitset_inplace_symmetric_difference(pbVar4,pbVar8);
    pcStack_b0 = (code *)0x101f5f;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 1000) goto LAB_00102019;
    pcStack_b0 = (code *)0x101f76;
    bitset_inplace_difference(pbVar4,pbVar8);
    pcStack_b0 = (code *)0x101f7e;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 1000) goto LAB_0010201e;
    pcStack_b0 = (code *)0x101f95;
    bitset_inplace_union(pbVar4,pbVar8);
    pcStack_b0 = (code *)0x101f9d;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 2000) goto LAB_00102023;
    pcStack_b0 = (code *)0x101fb0;
    bitset_inplace_intersection(pbVar4,pbVar8);
    pcStack_b0 = (code *)0x101fb8;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 1000) goto LAB_00102028;
    pcStack_b0 = (code *)0x101fcb;
    bitset_inplace_difference(pbVar4,pbVar8);
    pcStack_b0 = (code *)0x101fd3;
    sVar5 = bitset_count(pbVar4);
    if (sVar5 != 0) goto LAB_0010202d;
    pcStack_b0 = (code *)0x101fe3;
    bitset_inplace_union(pbVar4,pbVar8);
    pcStack_b0 = (code *)0x101fee;
    bitset_inplace_difference(pbVar8,pbVar4);
    pcStack_b0 = (code *)0x101ff6;
    sVar5 = bitset_count(pbVar8);
    if (sVar5 == 0) {
      pcStack_b0 = (code *)0x102003;
      bitset_free(pbVar4);
      bitset_free(pbVar8);
      return;
    }
  }
  else {
    pcStack_b0 = (code *)0x102019;
    test_union_intersection_cold_1();
LAB_00102019:
    pcStack_b0 = (code *)0x10201e;
    test_union_intersection_cold_2();
LAB_0010201e:
    pcStack_b0 = (code *)0x102023;
    test_union_intersection_cold_3();
LAB_00102023:
    pcStack_b0 = (code *)0x102028;
    test_union_intersection_cold_4();
LAB_00102028:
    pcStack_b0 = (code *)0x10202d;
    test_union_intersection_cold_5();
LAB_0010202d:
    pcStack_b0 = (code *)0x102032;
    test_union_intersection_cold_6();
  }
  pcStack_b0 = test_counts;
  test_union_intersection_cold_7();
  pcStack_e8 = (code *)0x102047;
  pbStack_d8 = pbVar4;
  uStack_d0 = uVar12;
  uStack_c8 = uVar21;
  pbStack_c0 = pbVar8;
  lStack_b8 = lVar9;
  pcStack_b0 = (code *)lVar13;
  pbVar4 = bitset_create();
  lVar9 = 0;
  pcStack_e8 = (code *)0x102052;
  pbVar8 = bitset_create();
  uVar21 = 0;
  uVar12 = 0;
  do {
    uVar14 = uVar12 >> 5;
    if (uVar14 < pbVar4->arraysize) {
LAB_00102078:
      pbVar4->array[uVar14] = pbVar4->array[uVar14] | 1L << ((byte)lVar9 & 0x3e);
    }
    else {
      pcStack_e8 = (code *)0x102074;
      _Var3 = bitset_grow(pbVar4,uVar14 + 1);
      if (_Var3) goto LAB_00102078;
    }
    uVar14 = uVar21 >> 6;
    if (uVar14 < pbVar8->arraysize) {
LAB_001020aa:
      pbVar8->array[uVar14] = pbVar8->array[uVar14] | 1L << ((byte)uVar21 & 0x3f);
    }
    else {
      pcStack_e8 = (code *)0x1020a6;
      _Var3 = bitset_grow(pbVar8,uVar14 + 1);
      if (_Var3) goto LAB_001020aa;
    }
    uVar12 = uVar12 + 1;
    uVar21 = uVar21 + 3;
    lVar9 = lVar9 + 2;
  } while (uVar12 != 1000);
  pcStack_e8 = (code *)0x1020db;
  sVar5 = bitset_intersection_count(pbVar4,pbVar8);
  if (sVar5 == 0x14e) {
    pcStack_e8 = (code *)0x1020ee;
    sVar5 = bitset_union_count(pbVar4,pbVar8);
    if (sVar5 == 0x682) {
      pcStack_e8 = (code *)0x1020fe;
      bitset_free(pbVar4);
      bitset_free(pbVar8);
      return;
    }
  }
  else {
    pcStack_e8 = (code *)0x102119;
    test_counts_cold_1();
  }
  pcStack_e8 = test_disjoint;
  test_counts_cold_2();
  pcStack_110 = (code *)0x10212c;
  pbStack_108 = pbVar4;
  lStack_100 = lVar9;
  uStack_f8 = uVar12;
  pbStack_f0 = pbVar8;
  pcStack_e8 = (code *)uVar21;
  pbVar4 = bitset_create();
  uVar12 = 0;
  pcStack_110 = (code *)0x102137;
  pbVar8 = bitset_create();
  do {
    uVar21 = uVar12 >> 6;
    if ((uVar12 & 1) == 0) {
      uVar14 = 0x3e;
      pbVar11 = pbVar4;
      if (uVar21 < pbVar4->arraysize) goto LAB_0010218d;
      pcStack_110 = (code *)0x102175;
      _Var3 = bitset_grow(pbVar4,uVar21 + 1);
LAB_00102189:
      if (_Var3 != false) goto LAB_0010218d;
    }
    else {
      uVar14 = 0x3f;
      pbVar11 = pbVar8;
      if (pbVar8->arraysize <= uVar21) {
        pcStack_110 = (code *)0x102186;
        _Var3 = bitset_grow(pbVar8,uVar21 + 1);
        goto LAB_00102189;
      }
LAB_0010218d:
      uVar20 = (uint)uVar14 & (uint)uVar12;
      uVar14 = (ulong)uVar20;
      pbVar11->array[uVar21] = pbVar11->array[uVar21] | 1L << (sbyte)uVar20;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 1000);
  pcStack_110 = (code *)0x1021b9;
  _Var3 = bitsets_disjoint(pbVar4,pbVar8);
  if (_Var3) {
    uVar14 = 0x20000000000000;
    if (pbVar4->arraysize < 8) {
      pcStack_110 = (code *)0x1021db;
      _Var3 = bitset_grow(pbVar4,8);
      if (_Var3) goto LAB_001021df;
    }
    else {
LAB_001021df:
      pbVar4->array[7] = pbVar4->array[7] | 0x20000000000000;
    }
    if (pbVar8->arraysize < 8) {
      pcStack_110 = (code *)0x1021fa;
      _Var3 = bitset_grow(pbVar8,8);
      if (_Var3) goto LAB_001021fe;
    }
    else {
LAB_001021fe:
      pbVar8->array[7] = pbVar8->array[7] | 0x20000000000000;
    }
    pcStack_110 = (code *)0x102210;
    _Var3 = bitsets_disjoint(pbVar4,pbVar8);
    if (!_Var3) {
      pcStack_110 = (code *)0x10221c;
      bitset_free(pbVar4);
      bitset_free(pbVar8);
      return;
    }
  }
  else {
    pcStack_110 = (code *)0x102232;
    test_disjoint_cold_1();
  }
  pcStack_110 = test_intersects;
  test_disjoint_cold_2();
  pbStack_138 = (bitset_t *)0x102245;
  pbStack_130 = pbVar4;
  uStack_128 = uVar12;
  uStack_120 = uVar21;
  pbStack_118 = pbVar8;
  pcStack_110 = (code *)uVar14;
  pbVar4 = bitset_create();
  pbStack_138 = (bitset_t *)0x10224d;
  pbVar8 = bitset_create();
  pbStack_138 = (bitset_t *)0x102258;
  _Var3 = bitset_empty(pbVar4);
  if (_Var3) {
    uVar12 = 0;
    do {
      uVar21 = uVar12 >> 6;
      if ((uVar12 & 1) == 0) {
        uVar14 = 0x3e;
        pbVar11 = pbVar4;
        if (uVar21 < pbVar4->arraysize) goto LAB_001022b6;
        pbStack_138 = (bitset_t *)0x10229e;
        _Var3 = bitset_grow(pbVar4,uVar21 + 1);
LAB_001022b2:
        if (_Var3 != false) goto LAB_001022b6;
      }
      else {
        uVar14 = 0x3f;
        pbVar11 = pbVar8;
        if (pbVar8->arraysize <= uVar21) {
          pbStack_138 = (bitset_t *)0x1022af;
          _Var3 = bitset_grow(pbVar8,uVar21 + 1);
          goto LAB_001022b2;
        }
LAB_001022b6:
        uVar20 = (uint)uVar14 & (uint)uVar12;
        uVar14 = (ulong)uVar20;
        pbVar11->array[uVar21] = pbVar11->array[uVar21] | 1L << (sbyte)uVar20;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 1000);
    pbStack_138 = (bitset_t *)0x1022e2;
    _Var3 = bitsets_intersect(pbVar4,pbVar8);
    if (_Var3) goto LAB_0010235b;
    uVar14 = 0x20000000000;
    if (pbVar4->arraysize < 0x10) {
      pbStack_138 = (bitset_t *)0x102304;
      _Var3 = bitset_grow(pbVar4,0x10);
      if (_Var3) goto LAB_00102308;
    }
    else {
LAB_00102308:
      pbVar4->array[0xf] = pbVar4->array[0xf] | 0x20000000000;
    }
    if (pbVar8->arraysize < 0x10) {
      pbStack_138 = (bitset_t *)0x102323;
      _Var3 = bitset_grow(pbVar8,0x10);
      if (_Var3) goto LAB_00102327;
    }
    else {
LAB_00102327:
      pbVar8->array[0xf] = pbVar8->array[0xf] | 0x20000000000;
    }
    pbStack_138 = (bitset_t *)0x102339;
    _Var3 = bitsets_intersect(pbVar4,pbVar8);
    if (_Var3) {
      pbStack_138 = (bitset_t *)0x102345;
      bitset_free(pbVar4);
      bitset_free(pbVar8);
      return;
    }
  }
  else {
    pbStack_138 = (bitset_t *)0x10235b;
    test_intersects_cold_1();
LAB_0010235b:
    pbStack_138 = (bitset_t *)0x102360;
    test_intersects_cold_3();
  }
  pbStack_138 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_150 = (code *)0x102373;
  pbStack_140 = pbVar4;
  pbStack_138 = pbVar8;
  pbVar4 = bitset_create_with_capacity(10);
  pcStack_150 = (code *)0x102380;
  pbVar8 = bitset_create_with_capacity(5);
  if (pbVar4->arraysize == 0) {
    pcStack_150 = (code *)0x102397;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_0010239b;
  }
  else {
LAB_0010239b:
    *pbVar4->array = *pbVar4->array | 2;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_150 = (code *)0x1023b6;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_001023ba;
  }
  else {
LAB_001023ba:
    *pbVar4->array = *pbVar4->array | 0x10;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_150 = (code *)0x1023d5;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_001023d9;
  }
  else {
LAB_001023d9:
    *pbVar4->array = *pbVar4->array | 0x40;
  }
  if (pbVar8->arraysize == 0) {
    pcStack_150 = (code *)0x1023f4;
    _Var3 = bitset_grow(pbVar8,1);
    if (_Var3) goto LAB_001023f8;
  }
  else {
LAB_001023f8:
    *pbVar8->array = *pbVar8->array | 2;
  }
  if (pbVar8->arraysize == 0) {
    pcStack_150 = (code *)0x102413;
    _Var3 = bitset_grow(pbVar8,1);
    if (_Var3) goto LAB_00102417;
  }
  else {
LAB_00102417:
    *pbVar8->array = *pbVar8->array | 0x10;
  }
  pcStack_150 = (code *)0x102429;
  _Var3 = bitset_contains_all(pbVar4,pbVar8);
  if (_Var3) {
    pcStack_150 = (code *)0x102438;
    _Var3 = bitset_contains_all(pbVar8,pbVar4);
    if (!_Var3) {
      pcStack_150 = (code *)0x102444;
      bitset_free(pbVar4);
      bitset_free(pbVar8);
      return;
    }
  }
  else {
    pcStack_150 = (code *)0x102458;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_150 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_178 = (code *)0x10246a;
  pbStack_168 = pbVar4;
  uStack_160 = 1000;
  pbStack_158 = pbVar8;
  pcStack_150 = (code *)uVar14;
  pbVar4 = bitset_create();
  uVar12 = 0;
  pcStack_178 = (code *)0x102475;
  pbVar8 = bitset_create();
  do {
    uVar21 = uVar12 >> 6;
    if (uVar21 < pbVar4->arraysize) {
LAB_00102496:
      pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)uVar12 & 0x3f);
    }
    else {
      pcStack_178 = (code *)0x102492;
      _Var3 = bitset_grow(pbVar4,uVar21 + 1);
      if (_Var3) goto LAB_00102496;
    }
    if ((uVar12 & 1) == 0) {
      if (pbVar8->arraysize <= uVar21) {
        pcStack_178 = (code *)0x1024c1;
        _Var3 = bitset_grow(pbVar8,uVar21 + 1);
        if (!_Var3) goto LAB_001024da;
      }
      pbVar8->array[uVar21] = pbVar8->array[uVar21] | 1L << ((byte)uVar12 & 0x3e);
    }
LAB_001024da:
    uVar12 = uVar12 + 1;
  } while (uVar12 != 1000);
  pcStack_178 = (code *)0x1024f1;
  _Var3 = bitset_contains_all(pbVar4,pbVar8);
  if (_Var3) {
    pcStack_178 = (code *)0x102500;
    _Var3 = bitset_contains_all(pbVar8,pbVar4);
    if (_Var3) goto LAB_0010256b;
    if (pbVar8->arraysize < 0x10) {
      pcStack_178 = (code *)0x102518;
      _Var3 = bitset_grow(pbVar8,0x10);
      if (_Var3) goto LAB_0010251c;
    }
    else {
LAB_0010251c:
      pbVar8->array[0xf] = pbVar8->array[0xf] | 0x20000000000;
    }
    pcStack_178 = (code *)0x102538;
    _Var3 = bitset_contains_all(pbVar4,pbVar8);
    if (!_Var3) {
      pcStack_178 = (code *)0x102547;
      _Var3 = bitset_contains_all(pbVar8,pbVar4);
      if (!_Var3) {
        pcStack_178 = (code *)0x102553;
        bitset_free(pbVar4);
        bitset_free(pbVar8);
        return;
      }
      goto LAB_00102575;
    }
  }
  else {
    pcStack_178 = (code *)0x10256b;
    test_contains_all_cold_1();
LAB_0010256b:
    pcStack_178 = (code *)0x102570;
    test_contains_all_cold_4();
  }
  pcStack_178 = (code *)0x102575;
  test_contains_all_cold_3();
LAB_00102575:
  pcStack_178 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar21 = 0;
  pbStack_188 = pbVar4;
  pbStack_180 = pbVar8;
  pcStack_178 = (code *)uVar12;
  pbVar4 = bitset_create();
  do {
    uVar12 = uVar21 >> 6;
    if (uVar12 < pbVar4->arraysize) {
LAB_001025ab:
      pbVar4->array[uVar12] = pbVar4->array[uVar12] | 1L << ((byte)uVar21 & 0x3f);
    }
    else {
      _Var3 = bitset_grow(pbVar4,uVar12 + 1);
      if (_Var3) goto LAB_001025ab;
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar21 = uVar12 >> 6;
    if (uVar21 < pbVar4->arraysize) {
LAB_001025ed:
      pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)uVar12 & 0x3e);
    }
    else {
      _Var3 = bitset_grow(pbVar4,uVar21 + 1);
      if (_Var3) goto LAB_001025ed;
    }
  } while (uVar12 < 0x44a);
  uVar12 = pbVar4->arraysize;
  uVar21 = 0;
  lVar9 = 0;
LAB_0010261a:
  uVar14 = uVar21 >> 6;
  if (uVar14 < uVar12) {
    puVar1 = pbVar4->array;
    uVar17 = (puVar1[uVar14] >> ((byte)uVar21 & 0x3f)) << ((byte)uVar21 & 0x3f);
    uVar16 = uVar21 & 0xffffffffffffffc0;
    uVar15 = 0;
    do {
      while (uVar17 == 0) {
        uVar14 = uVar14 + 1;
        if (uVar14 == uVar12) goto LAB_0010268b;
        uVar16 = uVar16 + 0x40;
        uVar17 = puVar1[uVar14];
        if (2 < uVar15) goto LAB_0010268b;
      }
      uVar19 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      auStack_1a8[uVar15] = uVar19 | uVar16;
      uVar19 = uVar17 - 1;
      if (uVar15 == 2) {
        uVar19 = 0xffffffffffffffff;
      }
      uVar15 = uVar15 + 1;
      uVar17 = uVar17 & uVar19;
    } while (uVar15 != 3);
    uVar15 = 3;
LAB_0010268b:
    if (uVar15 != 0) {
      uVar21 = auStack_1a8[uVar15 - 1];
    }
  }
  else {
    uVar15 = 0;
  }
  if (uVar15 != 0) {
    uVar14 = lVar9 * 2 + 800;
    uVar16 = 0;
    do {
      uVar19 = lVar9 + uVar16;
      if (99 < lVar9 + uVar16) {
        uVar19 = uVar14;
      }
      if (auStack_1a8[uVar16] != uVar19) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar16 = uVar16 + 1;
      uVar14 = uVar14 + 2;
    } while (uVar15 != uVar16);
    uVar21 = uVar21 + 1;
    lVar9 = uVar15 + lVar9;
    goto LAB_0010261a;
  }
  if (lVar9 == 0x96) {
    bitset_free(pbVar4);
    return;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar12 = 0;
  pbVar4 = bitset_create();
  do {
    uVar21 = uVar12 >> 6;
    if ((uVar21 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar21 + 1), _Var3)) {
      pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)uVar12 & 0x3f);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar21 = uVar12 >> 6;
    if ((uVar21 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar21 + 1), _Var3)) {
      pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)uVar12 & 0x3e);
    }
  } while (uVar12 < 0x44a);
  uVar12 = 0;
  uVar21 = 0;
  do {
    uVar14 = uVar12 >> 6;
    if (uVar14 < pbVar4->arraysize) {
      uVar15 = pbVar4->array[uVar14] >> ((byte)uVar12 & 0x3f);
      if (uVar15 == 0) {
        lVar9 = uVar14 * -0x40;
        do {
          uVar14 = uVar14 + 1;
          if (pbVar4->arraysize == uVar14) goto LAB_001027e0;
          uVar15 = pbVar4->array[uVar14];
          lVar9 = lVar9 + -0x40;
        } while (uVar15 == 0);
        lVar18 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
          }
        }
        uVar12 = lVar18 - lVar9;
      }
      else {
        lVar9 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar12 = uVar12 + lVar9;
      }
      bVar2 = true;
    }
    else {
LAB_001027e0:
      bVar2 = false;
    }
    if (!bVar2) {
      if (uVar21 == 0x96) {
        bitset_free(pbVar4);
        return;
      }
      goto LAB_00102822;
    }
    uVar14 = uVar21 * 2 + 800;
    if (uVar21 < 100) {
      uVar14 = uVar21;
    }
    if (uVar12 != uVar14) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return;
    }
    uVar21 = uVar21 + 1;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void test_max_min() {
  bitset_t *b = bitset_create();
  for (size_t k = 100; k < 1000; ++k) {
    bitset_set(b, 3 * k);
    TEST_ASSERT(bitset_minimum(b) == 3 * 100);
    TEST_ASSERT(bitset_maximum(b) == 3 * k);
  }
  bitset_free(b);
}